

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

_Bool malloc_init_hard(void)

{
  _Bool _Var1;
  tsd_t *tsd_00;
  long *in_FS_OFFSET;
  tsd_t *tsd;
  tsd_t *tsd_1;
  arena_t *in_stack_ffffffffffffff78;
  uint arena_ind;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 uVar2;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  tsd_t *in_stack_ffffffffffffff90;
  tsdn_t *in_stack_ffffffffffffff98;
  base_t *in_stack_ffffffffffffffa0;
  tsdn_t *in_stack_ffffffffffffffa8;
  tsd_t *local_30;
  
  uVar2 = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  malloc_mutex_lock(in_stack_ffffffffffffff98,(malloc_mutex_t *)in_stack_ffffffffffffff90);
  _Var1 = malloc_init_hard_needed();
  if (_Var1) {
    if ((duckdb_je_malloc_init_state == malloc_init_a0_initialized) ||
       (_Var1 = malloc_init_hard_a0_locked(), !_Var1)) {
      malloc_mutex_unlock((tsdn_t *)in_stack_ffffffffffffff90,
                          (malloc_mutex_t *)
                          CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      tsd_00 = duckdb_je_malloc_tsd_boot0();
      if (tsd_00 == (tsd_t *)0x0) {
        _Var1 = true;
      }
      else {
        _Var1 = malloc_init_hard_recursible();
        if (_Var1) {
          _Var1 = true;
        }
        else {
          malloc_mutex_lock(in_stack_ffffffffffffff98,(malloc_mutex_t *)in_stack_ffffffffffffff90);
          pre_reentrancy(tsd_00,in_stack_ffffffffffffff78);
          _Var1 = malloc_init_narenas();
          arena_ind = (uint)((ulong)tsd_00 >> 0x20);
          if (!_Var1) {
            duckdb_je_b0get();
            _Var1 = duckdb_je_background_thread_boot1
                              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
            uVar2 = (undefined1)((ulong)tsd_00 >> 0x38);
            if (!_Var1) {
              malloc_init_percpu();
              _Var1 = malloc_init_hard_finish();
              if (_Var1) {
                malloc_init_hard_cleanup
                          ((tsdn_t *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                           (_Bool)uVar2);
                return true;
              }
              post_reentrancy((tsd_t *)0x24b212e);
              malloc_mutex_unlock((tsdn_t *)in_stack_ffffffffffffff90,
                                  (malloc_mutex_t *)
                                  CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
              witness_assert_lockless((witness_tsdn_t *)0x24b2173);
              duckdb_je_malloc_tsd_boot1();
              local_30 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
              if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
                local_30 = duckdb_je_tsd_fetch_slow
                                     (in_stack_ffffffffffffff90,(_Bool)in_stack_ffffffffffffff8f);
              }
              if ((duckdb_je_opt_background_thread & 1U) != 0) {
                duckdb_je_background_thread_ctl_init((tsdn_t *)0x24b2228);
                _Var1 = duckdb_je_background_thread_create(local_30,arena_ind);
                if (_Var1) {
                  return true;
                }
              }
              return false;
            }
          }
          malloc_init_hard_cleanup
                    ((tsdn_t *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                     SUB81((ulong)tsd_00 >> 0x38,0));
          _Var1 = true;
        }
      }
    }
    else {
      malloc_init_hard_cleanup
                ((tsdn_t *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                 (_Bool)uVar2);
      _Var1 = true;
    }
  }
  else {
    malloc_init_hard_cleanup
              ((tsdn_t *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),(_Bool)uVar2)
    ;
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool
malloc_init_hard(void) {
	tsd_t *tsd;

#if defined(_WIN32) && _WIN32_WINNT < 0x0600
	_init_init_lock();
#endif
	malloc_mutex_lock(TSDN_NULL, &init_lock);

#define UNLOCK_RETURN(tsdn, ret, reentrancy)		\
	malloc_init_hard_cleanup(tsdn, reentrancy);	\
	return ret;

	if (!malloc_init_hard_needed()) {
		UNLOCK_RETURN(TSDN_NULL, false, false)
	}

	if (malloc_init_state != malloc_init_a0_initialized &&
	    malloc_init_hard_a0_locked()) {
		UNLOCK_RETURN(TSDN_NULL, true, false)
	}

	malloc_mutex_unlock(TSDN_NULL, &init_lock);
	/* Recursive allocation relies on functional tsd. */
	tsd = malloc_tsd_boot0();
	if (tsd == NULL) {
		return true;
	}
	if (malloc_init_hard_recursible()) {
		return true;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &init_lock);
	/* Set reentrancy level to 1 during init. */
	pre_reentrancy(tsd, NULL);
	/* Initialize narenas before prof_boot2 (for allocation). */
	if (malloc_init_narenas()
	    || background_thread_boot1(tsd_tsdn(tsd), b0get())) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	if (config_prof && prof_boot2(tsd, b0get())) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}

	malloc_init_percpu();

	if (malloc_init_hard_finish()) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	post_reentrancy(tsd);
	malloc_mutex_unlock(tsd_tsdn(tsd), &init_lock);

	witness_assert_lockless(witness_tsd_tsdn(
	    tsd_witness_tsdp_get_unsafe(tsd)));
	malloc_tsd_boot1();
	/* Update TSD after tsd_boot1. */
	tsd = tsd_fetch();
	if (opt_background_thread) {
		assert(have_background_thread);
		/*
		 * Need to finish init & unlock first before creating background
		 * threads (pthread_create depends on malloc).  ctl_init (which
		 * sets isthreaded) needs to be called without holding any lock.
		 */
		background_thread_ctl_init(tsd_tsdn(tsd));
		if (background_thread_create(tsd, 0)) {
			return true;
		}
	}
#undef UNLOCK_RETURN
	return false;
}